

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O2

double CWire::GetSegmentListCost(vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList)

{
  reference ppCVar1;
  int iVar2;
  int iVar3;
  size_type __n;
  ulong uVar4;
  ulong uVar5;
  
  if (pSegmentList != (vector<CSegment_*,_std::allocator<CSegment_*>_> *)0x0) {
    iVar2 = (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ -
            (int)(CObject::m_pDesign->super_CBBox).m_cMinZ;
    uVar4 = (ulong)((long)(pSegmentList->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pSegmentList->super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>)
                         ._M_impl.super__Vector_impl_data._M_start) >> 3;
    __n = 0;
    uVar5 = uVar4 & 0xffffffff;
    if ((int)uVar4 < 1) {
      uVar5 = __n;
    }
    iVar3 = 1;
    for (; uVar5 != __n; __n = __n + 1) {
      ppCVar1 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at(pSegmentList,__n);
      if (iVar3 <= (*ppCVar1)->m_pPointE->m_cZ) {
        ppCVar1 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at(pSegmentList,__n);
        iVar3 = (int)(*ppCVar1)->m_pPointE->m_cZ;
      }
      ppCVar1 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at(pSegmentList,__n);
      if ((*ppCVar1)->m_pPointE->m_cZ <= iVar2) {
        ppCVar1 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::at(pSegmentList,__n);
        iVar2 = (int)(*ppCVar1)->m_pPointE->m_cZ;
      }
    }
    return (double)((iVar3 - iVar2) + 1);
  }
  __assert_fail("pSegmentList",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                ,0x275,"static double CWire::GetSegmentListCost(vector<CSegment *> *)");
}

Assistant:

double CWire::GetSegmentListCost(vector<CSegment*>* pSegmentList)
{
	assert(pSegmentList);

	// via cost [2/10/2007 thyeros]
	int	iMaxZ	=	LAYER_METAL1;
	int	iMinZ	=	GetDesign()->T();

	for(int i=0,s=pSegmentList->size();i<s;++i)
	{
		iMaxZ	=	MAX(iMaxZ,pSegmentList->at(i)->m_pPointE->Z());
		iMinZ	=	MIN(iMinZ,pSegmentList->at(i)->m_pPointE->Z());
	}

	return	iMaxZ-iMinZ+1;
}